

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::Pop(DataParser *this,Register destination)

{
  Register local_84;
  value_type local_80;
  allocator<char> local_39;
  String local_38;
  Register local_14;
  DataParser *pDStack_10;
  Register destination_local;
  DataParser *this_local;
  
  local_14 = destination;
  pDStack_10 = this;
  if (this->program_stack_size < 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Internal parser error: Tried to pop an empty stack.",&local_39);
    Error(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator(&local_39);
  }
  else {
    this->program_stack_size = this->program_stack_size + -1;
    local_80.instruction = Pop;
    local_84 = destination;
    Variant::Variant<int,void>(&local_80.data,(int *)&local_84);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::push_back
              (&this->program,&local_80);
    InstructionData::~InstructionData(&local_80);
  }
  return;
}

Assistant:

void Pop(Register destination)
	{
		if (program_stack_size <= 0)
		{
			Error("Internal parser error: Tried to pop an empty stack.");
			return;
		}
		program_stack_size -= 1;
		program.push_back(InstructionData{Instruction::Pop, Variant(int(destination))});
	}